

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_info.cc
# Opt level: O2

size_t __thiscall
absl::lts_20250127::time_internal::cctz::anon_unknown_0::FileZoneInfoSource::Read
          (FileZoneInfoSource *this,void *ptr,size_t size)

{
  size_t sVar1;
  
  if (this->len_ < size) {
    size = this->len_;
  }
  sVar1 = fread(ptr,1,size,
                (FILE *)(this->fp_)._M_t.super___uniq_ptr_impl<_IO_FILE,_int_(*)(_IO_FILE_*)>._M_t.
                        super__Tuple_impl<0UL,__IO_FILE_*,_int_(*)(_IO_FILE_*)>.
                        super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl);
  this->len_ = this->len_ - sVar1;
  return sVar1;
}

Assistant:

std::size_t Read(void* ptr, std::size_t size) override {
    size = std::min(size, len_);
    std::size_t nread = fread(ptr, 1, size, fp_.get());
    len_ -= nread;
    return nread;
  }